

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::insert
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t index,bool bit)

{
  _Elt_pointer pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  subtree_const_ref t_00;
  subtree_ref t_01;
  subtree_ref t_02;
  subtree_ref t_03;
  bt_impl_t *count;
  bool bVar4;
  EVP_PKEY_CTX *src;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  bitview<bv::internal::bitarray_t<4096UL>::array> *this_00;
  pair<unsigned_long,_unsigned_long> pVar8;
  subtree_ref old_root;
  word_type wVar9;
  size_t sVar10;
  size_t local_108;
  subtree_ref_base<false> local_80;
  word_type local_58;
  size_t sStack_50;
  size_t sStack_48;
  size_t sStack_40;
  
  bVar4 = subtree_ref_base<false>::is_full(&t.super_subtree_ref_base<false>);
  if (bVar4) {
    subtree_ref::copy((subtree_ref *)&local_80,(EVP_PKEY_CTX *)&t.super_subtree_ref_base<false>,src)
    ;
    sVar7 = t.super_subtree_ref_base<false>._index *
            (t.super_subtree_ref_base<false>._vector)->degree;
    packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&(t.super_subtree_ref_base<false>._vector)->sizes,sVar7,
               (t.super_subtree_ref_base<false>._vector)->degree + sVar7,
               t.super_subtree_ref_base<false>._size);
    sVar7 = t.super_subtree_ref_base<false>._index *
            (t.super_subtree_ref_base<false>._vector)->degree;
    packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&(t.super_subtree_ref_base<false>._vector)->ranks,sVar7,
               (t.super_subtree_ref_base<false>._vector)->degree + sVar7,
               t.super_subtree_ref_base<false>._rank);
    sVar7 = ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
            t.super_subtree_ref_base<false>._index;
    packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&(t.super_subtree_ref_base<false>._vector)->pointers,sVar7,
               sVar7 + 1 + (t.super_subtree_ref_base<false>._vector)->degree,0);
    sVar7 = ((t.super_subtree_ref_base<false>._vector)->pointers)._width;
    lVar5 = ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
            t.super_subtree_ref_base<false>._index;
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&((t.super_subtree_ref_base<false>._vector)->pointers)._bits,lVar5 * sVar7,
               (lVar5 + 1) * sVar7,local_80._index);
    sVar7 = this->height + 1;
    this->height = sVar7;
    local_80._vector = this;
    wVar9 = 0;
    sVar10 = this->size;
    sVar6 = this->rank;
  }
  else {
    if (t.super_subtree_ref_base<false>._height == 0) {
      auVar3 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar2 = vpinsrq_avx(auVar3,(ulong)bit,1);
      auVar3._0_8_ = this->size;
      auVar3._8_8_ = this->rank;
      auVar3 = vpaddq_avx(auVar2,auVar3);
      this->size = auVar3._0_8_;
      this->rank = auVar3._8_8_;
      pbVar1 = ((t.super_subtree_ref_base<false>._vector)->leaves).
               super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar5 = ((long)pbVar1 -
               (long)((t.super_subtree_ref_base<false>._vector)->leaves).
                     super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 9) +
              t.super_subtree_ref_base<false>._index;
      if (lVar5 == 0) {
        this_00 = pbVar1 + t.super_subtree_ref_base<false>._index;
      }
      else {
        this_00 = ((t.super_subtree_ref_base<false>._vector)->leaves).
                  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
      }
      bitview<bv::internal::bitarray_t<4096UL>::array>::insert(this_00,index,bit);
      return;
    }
    pVar8 = subtree_ref_base<false>::find_insert_point(&t.super_subtree_ref_base<false>,index);
    subtree_ref_base<false>::child(&local_80,&t.super_subtree_ref_base<false>,pVar8.first);
    bVar4 = subtree_ref_base<false>::is_full(&local_80);
    if (bVar4) {
      t_00._index = t.super_subtree_ref_base<false>._index;
      t_00._vector = t.super_subtree_ref_base<false>._vector;
      t_00._height = t.super_subtree_ref_base<false>._height;
      t_00._size = t.super_subtree_ref_base<false>._size;
      t_00._rank = t.super_subtree_ref_base<false>._rank;
      find_adjacent_children
                ((tuple<unsigned_long,_unsigned_long,_unsigned_long> *)&local_80,this,t_00,
                 pVar8.first);
      sVar10 = local_80._height;
      count = local_80._vector;
      sVar7 = this->buffer;
      lVar5 = 0x1000 - sVar7;
      if (t.super_subtree_ref_base<false>._height != 1) {
        lVar5 = sVar7 + 1;
      }
      sVar6 = local_80._index;
      if ((bt_impl<4096UL,_(bv::allocation_policy_t)0> *)(lVar5 * sVar7) <= local_80._vector) {
        sVar6 = local_80._index + 1;
        subtree_ref::insert_child((subtree_ref *)&t.super_subtree_ref_base<false>,local_80._index);
      }
      if (t.super_subtree_ref_base<false>._height == 1) {
        t_01.super_subtree_ref_base<false>._index = t.super_subtree_ref_base<false>._index;
        t_01.super_subtree_ref_base<false>._vector = t.super_subtree_ref_base<false>._vector;
        t_01.super_subtree_ref_base<false>._height = 1;
        t_01.super_subtree_ref_base<false>._size = t.super_subtree_ref_base<false>._size;
        t_01.super_subtree_ref_base<false>._rank = t.super_subtree_ref_base<false>._rank;
        redistribute_bits(this,t_01,sVar10,sVar6,(size_t)count);
      }
      else {
        t_02.super_subtree_ref_base<false>._index = t.super_subtree_ref_base<false>._index;
        t_02.super_subtree_ref_base<false>._vector = t.super_subtree_ref_base<false>._vector;
        t_02.super_subtree_ref_base<false>._height = t.super_subtree_ref_base<false>._height;
        t_02.super_subtree_ref_base<false>._size = t.super_subtree_ref_base<false>._size;
        t_02.super_subtree_ref_base<false>._rank = t.super_subtree_ref_base<false>._rank;
        redistribute_keys(this,t_02,sVar10,sVar6,(size_t)count);
      }
      pVar8 = subtree_ref_base<false>::find_insert_point(&t.super_subtree_ref_base<false>,index);
    }
    local_108 = pVar8.second;
    sVar7 = pVar8.first;
    subtree_ref_base<false>::child(&local_80,&t.super_subtree_ref_base<false>,sVar7);
    lVar5 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    local_58 = local_80._index;
    sStack_50 = local_80._height;
    sStack_48 = local_80._size;
    sStack_40 = local_80._rank;
    packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
    increment(&(t.super_subtree_ref_base<false>._vector)->sizes,lVar5 + sVar7,lVar5 + this->degree,1
              ,cant_overflow);
    lVar5 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
    increment(&(t.super_subtree_ref_base<false>._vector)->ranks,sVar7 + lVar5,lVar5 + this->degree,
              (ulong)bit,cant_overflow);
    index = local_108;
    wVar9 = local_58;
    sVar7 = sStack_50;
    sVar10 = sStack_48;
    sVar6 = sStack_40;
  }
  t_03.super_subtree_ref_base<false>._index = wVar9;
  t_03.super_subtree_ref_base<false>._vector = local_80._vector;
  t_03.super_subtree_ref_base<false>._height = sVar7;
  t_03.super_subtree_ref_base<false>._size = sVar10;
  t_03.super_subtree_ref_base<false>._rank = sVar6;
  insert(this,t_03,index,bit);
  return;
}

Assistant:

void bt_impl<W, AP>::insert(subtree_ref t, size_t index, bool bit)
        {
            assert(index <= t.size() && "Index out of bounds");
            assert(size < capacity);
            
            // If we see a full node in this point it must be the root,
            // otherwise we've violated our invariants.
            // So, since it's a root and it's full, we prepare the split
            // by allocating a new node and swapping it with the old root,
            // thus ensuring the root is always at index zero.
            // Then we go ahead pretending we started the insertion from the
            // new root, so we don't duplicate the node splitting code
            // below
            // In small mode this should not happen, since this means that
            // the whole bitvector is full and we can't insert anything at all.
            if(t.is_full())
            {
                assert(t.is_root());
                assert(!small());
                
                // Copy the old root into another node
                subtree_ref old_root = t.copy();
                
                // Empty the root and make it point to the old one
                t.sizes() = t.size();
                t.ranks() = t.rank();
                t.pointers() = 0;
                t.pointers(0) = old_root.index();
                
                // The only point in the algorithm were the height increases
                ++height;
                
                assert(root().nchildren() == 1);
                assert(root().child(0).is_full());
                
                // Pretend we were inserting from the new root
                return insert(root(), index, bit);
            }
            
            // Hereafter we assume the node is not full
            
            // If we're inserting into a leaf, it's very simple.
            if(t.is_leaf())
            {
                // 1 - Update the counters
                size += 1;
                rank += bit;
                
                // 2 - Insert the bit
                return t.leaf().insert(index, bit);
            }
            
            // Else, we are in an internal node

            // 1 - Find where we have to insert this bit
            size_t child, new_index;
            tie(child, new_index) = t.find_insert_point(index);
            
            // 2 - Check if we need a split and/or a redistribution of bits
            if(t.child(child).is_full())
            {
                // 2.1 - Find the range of children that will be the target
                //       of the redistribution
                size_t begin, end, count;
                tie(begin, end, count) = find_adjacent_children(t, child);
                
                // 2.2 - Check if we need to split or only to redistribute
                if(count >= split_limit(t))
                    t.insert_child(end++);
                
                // 2.3 - Redistribute
                redistribute(t, begin, end, count);
                
                // 2.4 - Search again where to insert the bit
                tie(child, new_index) = t.find_insert_point(index);
            }
            
            // 3 - Get the ref to the child into which we're going to recurse,
            //     Note that we need to get the ref before incrementing the
            //     counters in the parent, for consistency
            subtree_ref child_ref = t.child(child);
            
            // 4 - Update counters
            t.sizes(child, degree) += 1;
            t.ranks(child, degree) += bit;
            
            // 5 - Insert recursively
            return insert(child_ref, new_index, bit);
        }